

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

int * __thiscall
google::protobuf::RepeatedField<int>::AddNAlreadyReserved(RepeatedField<int> *this,int n)

{
  int iVar1;
  
  iVar1 = this->current_size_;
  this->current_size_ = n + iVar1;
  return (int *)((long)iVar1 * 4 + (long)this->arena_or_elements_);
}

Assistant:

inline Element* RepeatedField<Element>::AddNAlreadyReserved(int n) {
  GOOGLE_DCHECK_GE(total_size_ - current_size_, n)
      << total_size_ << ", " << current_size_;
  // Warning: sometimes people call this when n == 0 and total_size_ == 0. In
  // this case the return pointer points to a zero size array (n == 0). Hence
  // we can just use unsafe_elements(), because the user cannot dereference the
  // pointer anyway.
  Element* ret = unsafe_elements() + current_size_;
  current_size_ += n;
  return ret;
}